

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QString * QSysInfo::buildCpuArchitecture(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff88;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff90;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_20,(Data *)0x0,L"x86_64",6);
  QString::QString((QString *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::buildCpuArchitecture()
{
    return QStringLiteral(ARCH_PROCESSOR);
}